

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O1

void __thiscall QHttpSocketEnginePrivate::QHttpSocketEnginePrivate(QHttpSocketEnginePrivate *this)

{
  QAbstractSocketEnginePrivate::QAbstractSocketEnginePrivate
            (&this->super_QAbstractSocketEnginePrivate);
  *(undefined ***)&this->super_QAbstractSocketEnginePrivate =
       &PTR__QHttpSocketEnginePrivate_002d4ac8;
  QNetworkProxy::QNetworkProxy(&this->proxy);
  (this->peerName).d.d = (Data *)0x0;
  (this->peerName).d.ptr = (char16_t *)0x0;
  (this->peerName).d.size = 0;
  QAuthenticator::QAuthenticator(&this->authenticator);
  this->pendingResponseData = 0;
  this->socket = (QTcpSocket *)0x0;
  this->reply = (QHttpNetworkReply *)0x0;
  this->state = None;
  this->readNotificationEnabled = false;
  this->writeNotificationEnabled = false;
  this->exceptNotificationEnabled = false;
  this->readNotificationPending = false;
  this->readNotificationPending = false;
  this->writeNotificationPending = false;
  this->connectionNotificationPending = false;
  this->credentialsSent = false;
  return;
}

Assistant:

QHttpSocketEnginePrivate::QHttpSocketEnginePrivate()
    : readNotificationEnabled(false)
    , writeNotificationEnabled(false)
    , exceptNotificationEnabled(false)
    , readNotificationPending(false)
    , writeNotificationPending(false)
    , connectionNotificationPending(false)
    , credentialsSent(false)
    , pendingResponseData(0)
{
    socket = nullptr;
    reply = nullptr;
    state = QHttpSocketEngine::None;
}